

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O3

FxExpression * __thiscall FxUnaryNotBoolean::Resolve(FxUnaryNotBoolean *this,FCompileContext *ctx)

{
  PString *pPVar1;
  PBool *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  FxBoolCast *this_00;
  FxExpression *pFVar4;
  TArray<FxJumpStatement_*,_FxJumpStatement_*> *other;
  bool bVar5;
  FString local_30;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  if (this->Operand != (FxExpression *)0x0) {
    iVar3 = (*this->Operand->_vptr_FxExpression[2])();
    pFVar4 = (FxExpression *)CONCAT44(extraout_var,iVar3);
    this->Operand = pFVar4;
    if (pFVar4 != (FxExpression *)0x0) {
      if (pFVar4->ValueType != (PType *)TypeBool) {
        this_00 = (FxBoolCast *)operator_new(0x40);
        FxExpression::FxExpression((FxExpression *)this_00,&pFVar4->ScriptPosition);
        (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxBoolCast_0088e480;
        this_00->basex = pFVar4;
        (this_00->super_FxExpression).ValueType = (PType *)TypeBool;
        this->Operand = (FxExpression *)this_00;
        pFVar4 = FxBoolCast::Resolve(this_00,ctx);
        this->Operand = pFVar4;
        if (pFVar4 == (FxExpression *)0x0) goto LAB_0068ec6d;
      }
      iVar3 = (*pFVar4->_vptr_FxExpression[3])(pFVar4);
      if ((char)iVar3 == '\0') {
        (this->super_FxExpression).ValueType = (PType *)TypeBool;
        return &this->super_FxExpression;
      }
      pPVar1 = (PString *)this->Operand[1]._vptr_FxExpression;
      other = &this->Operand[1].JumpAddresses;
      if (pPVar1 == TypeString) {
        FString::AttachToOther(&local_30,(FString *)other);
      }
      else {
        local_30.Chars = (char *)other->Array;
      }
      iVar3 = (*(pPVar1->super_PBasicType).super_PType.super_DObject._vptr_DObject[0x12])();
      if (iVar3 == 1) {
        bVar5 = (bool)(-((double)local_30.Chars != 0.0) & 1);
      }
      else if (iVar3 == 0) {
        bVar5 = (int)local_30.Chars != 0;
      }
      else {
        bVar5 = false;
      }
      if (pPVar1 == TypeString) {
        FString::~FString(&local_30);
      }
      pFVar4 = (FxExpression *)operator_new(0x48);
      FxExpression::FxExpression(pFVar4,&(this->super_FxExpression).ScriptPosition);
      pFVar4->_vptr_FxExpression = (_func_int **)&PTR__FxConstant_0088f2f0;
      pPVar2 = TypeBool;
      *(PBool **)(pFVar4 + 1) = TypeBool;
      pFVar4->ValueType = (PType *)pPVar2;
      *(uint *)&pFVar4[1].JumpAddresses.Array = (uint)(bVar5 ^ 1);
      pFVar4->isresolved = true;
      (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
      return pFVar4;
    }
  }
LAB_0068ec6d:
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  return (FxExpression *)0x0;
}

Assistant:

FxExpression *FxUnaryNotBoolean::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(Operand, ctx);

	if (Operand->ValueType != TypeBool)
	{
		Operand = new FxBoolCast(Operand);
		SAFE_RESOLVE(Operand, ctx);
	}

	if (Operand->isConstant())
	{
		bool result = !static_cast<FxConstant *>(Operand)->GetValue().GetBool();
		FxExpression *e = new FxConstant(result, ScriptPosition);
		delete this;
		return e;
	}

	ValueType = TypeBool;
	return this;
}